

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O0

void __thiscall QFont::detach(QFont *this)

{
  QFontEngineData *pQVar1;
  bool bVar2;
  int iVar3;
  QFontPrivate *pQVar4;
  QFontPrivate *pQVar5;
  QFontEngineData *in_RDI;
  QExplicitlySharedDataPointer<QFontPrivate> *in_stack_ffffffffffffffe0;
  
  QExplicitlySharedDataPointer<QFontPrivate>::operator->
            ((QExplicitlySharedDataPointer<QFontPrivate> *)0x7111cc);
  iVar3 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x7111d4);
  if (iVar3 == 1) {
    pQVar4 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QFontPrivate> *)0x7111e7);
    if (pQVar4->engineData != (QFontEngineData *)0x0) {
      QExplicitlySharedDataPointer<QFontPrivate>::operator->
                ((QExplicitlySharedDataPointer<QFontPrivate> *)0x7111f8);
      bVar2 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x711201);
      if (!bVar2) {
        pQVar4 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                           ((QExplicitlySharedDataPointer<QFontPrivate> *)0x71120f);
        pQVar1 = pQVar4->engineData;
        if (pQVar1 != (QFontEngineData *)0x0) {
          QFontEngineData::~QFontEngineData(in_RDI);
          operator_delete(pQVar1,0x568);
        }
      }
    }
    pQVar4 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QFontPrivate> *)0x711243);
    pQVar4->engineData = (QFontEngineData *)0x0;
    pQVar4 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QFontPrivate> *)0x711255);
    if (pQVar4->scFont != (QFontPrivate *)0x0) {
      pQVar4 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QFontPrivate> *)0x711269);
      pQVar4 = pQVar4->scFont;
      pQVar5 = QExplicitlySharedDataPointer<QFontPrivate>::data
                         ((QExplicitlySharedDataPointer<QFontPrivate> *)0x71127f);
      if (pQVar4 != pQVar5) {
        QExplicitlySharedDataPointer<QFontPrivate>::operator->
                  ((QExplicitlySharedDataPointer<QFontPrivate> *)0x711296);
        bVar2 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x7112a2);
        if (!bVar2) {
          pQVar4 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                             ((QExplicitlySharedDataPointer<QFontPrivate> *)0x7112b0);
          pQVar4 = pQVar4->scFont;
          if (pQVar4 != (QFontPrivate *)0x0) {
            QFontPrivate::~QFontPrivate((QFontPrivate *)in_RDI);
            operator_delete(pQVar4,0x98);
          }
        }
      }
    }
    pQVar4 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QFontPrivate> *)0x7112e6);
    pQVar4->scFont = (QFontPrivate *)0x0;
  }
  else {
    QExplicitlySharedDataPointer<QFontPrivate>::detach(in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

void QFont::detach()
{
    if (d->ref.loadRelaxed() == 1) {
        if (d->engineData && !d->engineData->ref.deref())
            delete d->engineData;
        d->engineData = nullptr;
        if (d->scFont && d->scFont != d.data()) {
            if (!d->scFont->ref.deref())
                delete d->scFont;
        }
        d->scFont = nullptr;
        return;
    }

    d.detach();
}